

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O3

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[41],unsigned_int,char[53],unsigned_int,char[2]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [41],uint *RestArgs,char (*RestArgs_1) [53],uint *RestArgs_2,
               char (*RestArgs_3) [2])

{
  size_t sVar1;
  
  sVar1 = strlen(*FirstArg);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(ss + 0x10),*FirstArg,sVar1);
  std::ostream::_M_insert<unsigned_long>((ulong)(ss + 0x10));
  FormatStrSS<std::__cxx11::stringstream,char[53],unsigned_int,char[2]>
            (ss,RestArgs_1,RestArgs_2,RestArgs_3);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}